

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O0

void FAudio_INTERNAL_Convert_U8_To_F32_SSE2(uint8_t *src,float *dst,uint32_t len)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  undefined1 auVar5 [16];
  __m128 floats4;
  __m128 floats3;
  __m128 floats2;
  __m128 floats1;
  __m128i shorts2;
  __m128i shorts1;
  __m128i bytes;
  __m128 minus1;
  __m128 divby128;
  __m128i zero;
  __m128i *mmsrc;
  SDL_AssertState sdl_assert_state;
  int i;
  undefined1 (*local_3a0) [16];
  int local_390;
  float *local_388;
  undefined1 (*local_380) [16];
  ushort local_318;
  ushort uStack_316;
  ushort uStack_314;
  ushort uStack_312;
  ushort uStack_310;
  ushort uStack_30e;
  ushort uStack_30c;
  ushort uStack_30a;
  ushort local_2f8;
  ushort uStack_2f6;
  ushort uStack_2f4;
  ushort uStack_2f2;
  ushort uStack_2f0;
  ushort uStack_2ee;
  ushort uStack_2ec;
  ushort uStack_2ea;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  
  local_380 = (undefined1 (*) [16])(in_RDI + (ulong)(in_EDX - 1));
  local_388 = (float *)(in_RSI + (ulong)(in_EDX - 1) * 4);
  for (local_390 = in_EDX; local_390 != 0 && ((ulong)(local_388 + -0xf) & 0xf) != 0;
      local_390 = local_390 + -1) {
    *local_388 = (float)*(byte *)local_380 * 0.0078125 + -1.0;
    local_380 = (undefined1 (*) [16])((long)local_380 + -1);
    local_388 = local_388 + -1;
  }
  local_3a0 = (undefined1 (*) [16])((long)local_380 + -0xf);
  local_388 = local_388 + -0xf;
  do {
    if (local_390 == 0 || ((ulong)local_388 & 0xf) == 0) goto LAB_00131984;
    iVar4 = SDL_ReportAssertion(&FAudio_INTERNAL_Convert_U8_To_F32_SSE2::sdl_assert_data,
                                "FAudio_INTERNAL_Convert_U8_To_F32_SSE2",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio_internal_simd.c"
                                ,0x8c);
  } while (iVar4 == 0);
  if (iVar4 == 1) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
LAB_00131984:
  local_380 = local_3a0;
  if (((ulong)local_3a0 & 0xf) == 0) {
    for (; 0xf < local_390; local_390 = local_390 + -0x10) {
      uVar2 = *(undefined8 *)*local_3a0;
      uVar3 = *(undefined8 *)(*local_3a0 + 8);
      auVar5 = psllw(*local_3a0,ZEXT416(8));
      local_2f8 = auVar5._0_2_;
      uStack_2f6 = auVar5._2_2_;
      uStack_2f4 = auVar5._4_2_;
      uStack_2f2 = auVar5._6_2_;
      uStack_2f0 = auVar5._8_2_;
      uStack_2ee = auVar5._10_2_;
      uStack_2ec = auVar5._12_2_;
      uStack_2ea = auVar5._14_2_;
      local_318 = (ushort)uVar2;
      uStack_316 = (ushort)((ulong)uVar2 >> 0x10);
      uStack_314 = (ushort)((ulong)uVar2 >> 0x20);
      uStack_310 = (ushort)uVar3;
      uStack_30e = (ushort)((ulong)uVar3 >> 0x10);
      uStack_30c = (ushort)((ulong)uVar3 >> 0x20);
      uStack_194 = (uint)(uStack_2f6 >> 8);
      uStack_190 = (uint)(uStack_2f4 >> 8);
      uStack_18c = (uint)(uStack_2f2 >> 8);
      uStack_1a4 = (uint)(uStack_316 >> 8);
      uStack_1a0 = (uint)(uStack_314 >> 8);
      uStack_19c = (uint)(ushort)((ulong)uVar2 >> 0x38);
      uStack_1b4 = (uint)(uStack_2ee >> 8);
      uStack_1b0 = (uint)(uStack_2ec >> 8);
      uStack_1ac = (uint)(uStack_2ea >> 8);
      uStack_1c4 = (uint)(uStack_30e >> 8);
      uStack_1c0 = (uint)(uStack_30c >> 8);
      uStack_1bc = (uint)(ushort)((ulong)uVar3 >> 0x38);
      *(ulong *)local_388 =
           CONCAT44((float)(local_318 >> 8) * 0.0078125 + -1.0,
                    (float)(local_2f8 >> 8) * 0.0078125 + -1.0);
      *(ulong *)(local_388 + 2) =
           CONCAT44((float)uStack_1a4 * 0.0078125 + -1.0,(float)uStack_194 * 0.0078125 + -1.0);
      *(ulong *)(local_388 + 4) =
           CONCAT44((float)uStack_1a0 * 0.0078125 + -1.0,(float)uStack_190 * 0.0078125 + -1.0);
      *(ulong *)(local_388 + 6) =
           CONCAT44((float)uStack_19c * 0.0078125 + -1.0,(float)uStack_18c * 0.0078125 + -1.0);
      *(ulong *)(local_388 + 8) =
           CONCAT44((float)(uStack_310 >> 8) * 0.0078125 + -1.0,
                    (float)(uStack_2f0 >> 8) * 0.0078125 + -1.0);
      *(ulong *)(local_388 + 10) =
           CONCAT44((float)uStack_1c4 * 0.0078125 + -1.0,(float)uStack_1b4 * 0.0078125 + -1.0);
      auVar5._4_4_ = (float)uStack_1c0 * 0.0078125 + -1.0;
      auVar5._0_4_ = (float)uStack_1b0 * 0.0078125 + -1.0;
      auVar5._8_4_ = (float)uStack_1ac * 0.0078125 + -1.0;
      auVar5._12_4_ = (float)uStack_1bc * 0.0078125 + -1.0;
      *(undefined1 (*) [16])(local_388 + 0xc) = auVar5;
      local_3a0 = local_3a0 + -1;
      local_388 = local_388 + -0x10;
    }
    local_380 = local_3a0;
  }
  local_380 = (undefined1 (*) [16])(*local_380 + 0xf);
  local_388 = local_388 + 0xf;
  for (; local_390 != 0; local_390 = local_390 + -1) {
    *local_388 = (float)*(byte *)local_380 * 0.0078125 + -1.0;
    local_380 = (undefined1 (*) [16])((long)local_380 + -1);
    local_388 = local_388 + -1;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Convert_U8_To_F32_SSE2(
	const uint8_t *restrict src,
	float *restrict dst,
	uint32_t len
) {
    int i;
    src += len - 1;
    dst += len - 1;

    /* Get dst aligned to 16 bytes (since buffer is growing, we don't have to worry about overreading from src) */
    for (i = len; i && (((size_t) (dst-15)) & 15); --i, --src, --dst) {
        *dst = (((float) *src) * DIVBY128) - 1.0f;
    }

    src -= 15; dst -= 15;  /* adjust to read SSE blocks from the start. */
    FAudio_assert(!i || ((((size_t) dst) & 15) == 0));

    /* Make sure src is aligned too. */
    if ((((size_t) src) & 15) == 0) {
        /* Aligned! Do SSE blocks as long as we have 16 bytes available. */
        const __m128i *mmsrc = (const __m128i *) src;
        const __m128i zero = _mm_setzero_si128();
        const __m128 divby128 = _mm_set1_ps(DIVBY128);
        const __m128 minus1 = _mm_set1_ps(-1.0f);
        while (i >= 16) {   /* 16 * 8-bit */
            const __m128i bytes = _mm_load_si128(mmsrc);  /* get 16 uint8 into an XMM register. */
            /* treat as int16, shift left to clear every other sint16, then back right with zero-extend. Now uint16. */
            const __m128i shorts1 = _mm_srli_epi16(_mm_slli_epi16(bytes, 8), 8);
            /* right-shift-zero-extend gets us uint16 with the other set of values. */
            const __m128i shorts2 = _mm_srli_epi16(bytes, 8);
            /* unpack against zero to make these int32, convert to float, multiply, add. Whew! */
            /* Note that AVX2 can do floating point multiply+add in one instruction, fwiw. SSE2 cannot. */
            const __m128 floats1 = _mm_add_ps(_mm_mul_ps(_mm_cvtepi32_ps(_mm_unpacklo_epi16(shorts1, zero)), divby128), minus1);
            const __m128 floats2 = _mm_add_ps(_mm_mul_ps(_mm_cvtepi32_ps(_mm_unpacklo_epi16(shorts2, zero)), divby128), minus1);
            const __m128 floats3 = _mm_add_ps(_mm_mul_ps(_mm_cvtepi32_ps(_mm_unpackhi_epi16(shorts1, zero)), divby128), minus1);
            const __m128 floats4 = _mm_add_ps(_mm_mul_ps(_mm_cvtepi32_ps(_mm_unpackhi_epi16(shorts2, zero)), divby128), minus1);
            /* Interleave back into correct order, store. */
            _mm_store_ps(dst, _mm_unpacklo_ps(floats1, floats2));
            _mm_store_ps(dst+4, _mm_unpackhi_ps(floats1, floats2));
            _mm_store_ps(dst+8, _mm_unpacklo_ps(floats3, floats4));
            _mm_store_ps(dst+12, _mm_unpackhi_ps(floats3, floats4));
            i -= 16; mmsrc--; dst -= 16;
        }

        src = (const uint8_t *) mmsrc;
    }

    src += 15; dst += 15;  /* adjust for any scalar finishing. */

    /* Finish off any leftovers with scalar operations. */
    while (i) {
        *dst = (((float) *src) * DIVBY128) - 1.0f;
        i--; src--; dst--;
    }
}